

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffc2dd(char *cval,double *dval,int *status)

{
  ushort uVar1;
  char cVar2;
  lconv *plVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  char *__nptr;
  double dVar7;
  char *loc;
  char tval [73];
  char msg [81];
  byte *local_e0;
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (ffc2dd::decimalpt == '\0') {
    plVar3 = localeconv();
    ffc2dd::decimalpt = *plVar3->decimal_point;
  }
  cVar2 = ffc2dd::decimalpt;
  piVar4 = __errno_location();
  *piVar4 = 0;
  *dval = 0.0;
  pcVar5 = strchr(cval,0x44);
  __nptr = cval;
  if (cVar2 == ',' || pcVar5 != (char *)0x0) {
    sVar6 = strlen(cval);
    if (0x48 < sVar6) {
      builtin_strncpy(local_88 + 0x20,"in ffc2dd",10);
      builtin_strncpy(local_88 + 0x10,"tring to double ",0x10);
      builtin_strncpy(local_88,"Error: Invalid s",0x10);
      ffxmsg(5,local_88);
      *status = 0x199;
      return 0x199;
    }
    strcpy(local_d8,cval);
    local_e0 = (byte *)strchr(local_d8,0x44);
    if (local_e0 != (byte *)0x0) {
      *local_e0 = 0x45;
    }
    if ((cVar2 == ',') && (local_e0 = (byte *)strchr(local_d8,0x2e), local_e0 != (byte *)0x0)) {
      *local_e0 = 0x2c;
    }
    __nptr = local_d8;
  }
  dVar7 = strtod(__nptr,(char **)&local_e0);
  *dval = dVar7;
  if ((*local_e0 & 0xdf) == 0) {
    uVar1 = (ushort)((ulong)dVar7 >> 0x30);
  }
  else {
    builtin_strncpy(local_88 + 0x20,"g to double: ",0xe);
    builtin_strncpy(local_88 + 0x10,"converting strin",0x10);
    builtin_strncpy(local_88,"Error in ffc2dd ",0x10);
    strncat(local_88,cval,0x1e);
    ffxmsg(5,local_88);
    *status = 0x199;
    uVar1 = *(ushort *)((long)dval + 6);
  }
  if ((*piVar4 == 0x22) || ((uVar1 & 0x7ff0) == 0x7ff0)) {
    builtin_strncpy(local_88 + 0x20,"g to double: ",0xe);
    builtin_strncpy(local_88 + 0x10,"converting strin",0x10);
    builtin_strncpy(local_88,"Error in ffc2dd ",0x10);
    strncat(local_88,cval,0x1e);
    ffxmsg(5,local_88);
    *dval = 0.0;
    *status = 0x19c;
    *piVar4 = 0;
  }
  return *status;
}

Assistant:

int ffc2dd(const char *cval,   /* I - string representation of the value */
           double *dval,       /* O - numerical value of the input string */
           int *status)        /* IO - error status */
/*
  convert null-terminated formatted string to a double value
*/
{
    char *loc, msg[81], tval[73];
    struct lconv *lcc = 0;
    static char decimalpt = 0;
    short *sptr, iret;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (!decimalpt) { /* only do this once for efficiency */
       lcc = localeconv();   /* set structure containing local decimal point symbol */
       decimalpt = *(lcc->decimal_point);
    }
   
    errno = 0;
    *dval = 0.;

    if (strchr(cval, 'D') || decimalpt == ',') {
        /* need to modify a temporary copy of the string before parsing it */
        if (strlen(cval) > 72)
        {
           strcpy(msg,"Error: Invalid string to double in ffc2dd");
           ffpmsg(msg);
           return (*status=BAD_C2D);
        }
        strcpy(tval, cval);
        /*  The C language does not support a 'D'; replace with 'E' */
        if ((loc = strchr(tval, 'D'))) *loc = 'E';

        if (decimalpt == ',')  {
            /* strtod expects a comma, not a period, as the decimal point */
            if ((loc = strchr(tval, '.')))  *loc = ',';   
        }
    
        *dval = strtod(tval, &loc);  /* read the string as an double */
    } else {
        *dval = strtod(cval, &loc);
    }

    /* check for read error, or junk following the value */
    if (*loc != '\0' && *loc != ' ' )
    {
        strcpy(msg,"Error in ffc2dd converting string to double: ");
        strncat(msg,cval,30);
        ffpmsg(msg);

        *status = BAD_C2D;   
    }

    sptr = (short *) dval;
#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
    sptr += 3;       /* point to MSBs */
#endif
    iret = dnan(*sptr);  /* if iret == 1, then the double value is a NaN */

    if (errno == ERANGE || (iret == 1) )
    {
        strcpy(msg,"Error in ffc2dd converting string to double: ");
        strncat(msg,cval,30);
        ffpmsg(msg);
	*dval = 0.;

        *status = NUM_OVERFLOW;
        errno = 0;
    }

    return(*status);
}